

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O1

void point_based_points(game_event_type type,game_event_data *data,void *user)

{
  wchar_t wVar1;
  char *pcVar2;
  uint uVar3;
  char *str;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  wchar_t row;
  
  pcVar4 = data->string;
  pcVar2 = (data->birthstage).hint;
  wVar1 = (data->birthstage).n_choices;
  put_str("Cost",L'\x01',L'J');
  row = L'\x02';
  lVar6 = 0;
  uVar5 = 0;
  do {
    *(undefined4 *)((long)buysell + lVar6) = 0;
    uVar3 = (uint)(0 < *(int *)(pcVar4 + lVar6));
    *(uint *)((long)buysell + lVar6) = uVar3;
    if (*(wchar_t *)(pcVar2 + lVar6) <= wVar1) {
      *(uint *)((long)buysell + lVar6) = uVar3 | 2;
    }
    str = format("%4d");
    put_str(str,row,L'J');
    uVar5 = uVar5 + *(int *)(pcVar4 + lVar6);
    row = row + L'\x01';
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x14);
  pcVar4 = format("Total Cost: %2d/%2d",(ulong)uVar5,(ulong)(uint)(wVar1 + uVar5));
  put_str(pcVar4,L'\a',L'=');
  return;
}

Assistant:

static void point_based_points(game_event_type type, game_event_data *data,
							   void *user)
{
	int i;
	int sum = 0;
	const int *spent = data->birthpoints.points;
	const int *inc = data->birthpoints.inc_points;
	int remaining = data->birthpoints.remaining;

	/* Display the costs header */
	put_str("Cost", COSTS_ROW - 1, COSTS_COL);
	
	for (i = 0; i < STAT_MAX; i++) {
		/* Remember what's allowed. */
		buysell[i] = 0;
		if (spent[i] > 0) {
			buysell[i] |= 1;
		}
		if (inc[i] <= remaining) {
			buysell[i] |= 2;
		}
		/* Display cost */
		put_str(format("%4d", spent[i]), COSTS_ROW + i, COSTS_COL);
		sum += spent[i];
	}
	
	put_str(format("Total Cost: %2d/%2d", sum, remaining + sum),
		COSTS_ROW + STAT_MAX, TOTAL_COL);
}